

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format.cc
# Opt level: O3

uint8_t * google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                    (UnknownFieldSet *unknown_fields,uint8_t *target,EpsCopyOutputStream *stream)

{
  uint32_t uVar1;
  anon_union_8_5_912831f5_for_data_ aVar2;
  string *s;
  size_t __n;
  bool bVar3;
  byte *pbVar4;
  anon_union_8_5_912831f5_for_data_ *paVar5;
  uint32_t *puVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  pointer pUVar14;
  
  pUVar14 = (unknown_fields->fields_).
            super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (0 < (int)((ulong)((long)(unknown_fields->fields_).
                              super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar14) >> 4)) {
    lVar13 = 0;
    do {
      if ((anon_union_8_5_912831f5_for_data_ *)stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      pUVar14 = pUVar14 + lVar13;
      switch(pUVar14->type_) {
      case 0:
        uVar8 = (pUVar14->data_).varint_;
        uVar9 = pUVar14->number_ << 3;
        *target = (byte)uVar9;
        if (uVar9 < 0x80) {
          pbVar4 = (byte *)((long)target + 1);
        }
        else {
          *target = (byte)uVar9 | 0x80;
          *(byte *)((long)target + 1) = (byte)(uVar9 >> 7);
          pbVar4 = (byte *)((long)target + 2);
          if (0x3fff < uVar9) {
            uVar10 = (uint)*(byte *)((long)target + 1);
            uVar9 = uVar9 >> 7;
            do {
              pbVar4[-1] = (byte)uVar10 | 0x80;
              uVar10 = uVar9 >> 7;
              *pbVar4 = (byte)uVar10;
              pbVar4 = pbVar4 + 1;
              bVar3 = 0x3fff < uVar9;
              uVar9 = uVar10;
            } while (bVar3);
          }
        }
        *pbVar4 = (byte)uVar8;
        if (uVar8 < 0x80) {
          target = pbVar4 + 1;
        }
        else {
          *pbVar4 = (byte)uVar8 | 0x80;
          pbVar4[1] = (byte)(uVar8 >> 7);
          target = pbVar4 + 2;
          if (0x3fff < uVar8) {
            uVar11 = (ulong)pbVar4[1];
            uVar8 = uVar8 >> 7;
            do {
              *(byte *)((long)target + -1) = (byte)uVar11 | 0x80;
              uVar7 = uVar8 >> 7;
              *target = (byte)uVar7;
              target = (uint8_t *)((long)target + 1);
              uVar11 = uVar7 & 0xffffffff;
              bVar3 = 0x3fff < uVar8;
              uVar8 = uVar7;
            } while (bVar3);
          }
        }
        break;
      case 1:
        uVar1 = (pUVar14->data_).fixed32_;
        uVar9 = pUVar14->number_ << 3;
        *target = (byte)uVar9 + 5;
        if (uVar9 < 0x80) {
          puVar6 = (uint32_t *)((long)target + 1);
        }
        else {
          *target = (byte)uVar9 | 0x85;
          *(byte *)((long)target + 1) = (byte)(uVar9 >> 7);
          puVar6 = (uint32_t *)((long)target + 2);
          if (0x3fff < uVar9) {
            uVar10 = (uint)*(byte *)((long)target + 1);
            uVar9 = uVar9 >> 7;
            do {
              *(byte *)((long)puVar6 + -1) = (byte)uVar10 | 0x80;
              uVar10 = uVar9 >> 7;
              *(byte *)puVar6 = (byte)uVar10;
              puVar6 = (uint32_t *)((long)puVar6 + 1);
              bVar3 = 0x3fff < uVar9;
              uVar9 = uVar10;
            } while (bVar3);
          }
        }
        *puVar6 = uVar1;
        target = (uint8_t *)(puVar6 + 1);
        break;
      case 2:
        aVar2 = pUVar14->data_;
        uVar9 = pUVar14->number_ << 3;
        *target = (byte)uVar9 + 1;
        if (uVar9 < 0x80) {
          paVar5 = (anon_union_8_5_912831f5_for_data_ *)((long)target + 1);
        }
        else {
          *target = (byte)uVar9 | 0x81;
          *(byte *)((long)target + 1) = (byte)(uVar9 >> 7);
          paVar5 = (anon_union_8_5_912831f5_for_data_ *)((long)target + 2);
          if (0x3fff < uVar9) {
            uVar10 = (uint)*(byte *)((long)target + 1);
            uVar9 = uVar9 >> 7;
            do {
              *(byte *)((long)paVar5 + -1) = (byte)uVar10 | 0x80;
              uVar10 = uVar9 >> 7;
              *(byte *)paVar5 = (byte)uVar10;
              paVar5 = (anon_union_8_5_912831f5_for_data_ *)((long)paVar5 + 1);
              bVar3 = 0x3fff < uVar9;
              uVar9 = uVar10;
            } while (bVar3);
          }
        }
        *paVar5 = aVar2;
        target = (uint8_t *)(paVar5 + 1);
        break;
      case 3:
        s = (string *)(pUVar14->data_).group_;
        __n = s->_M_string_length;
        if ((long)__n < 0x80) {
          uVar9 = pUVar14->number_ * 8;
          lVar12 = 1;
          if (((0x7f < uVar9) && (lVar12 = 2, 0x3fff < uVar9)) && (lVar12 = 3, 0x1fffff < uVar9)) {
            lVar12 = 5 - (ulong)(uVar9 < 0x10000000);
          }
          if ((long)__n <= (long)(stream->end_ + ~(ulong)(lVar12 + (long)target) + 0x10)) {
            *target = (byte)uVar9 | 2;
            if (uVar9 < 0x80) {
              pbVar4 = (byte *)((long)target + 1);
            }
            else {
              *target = (byte)uVar9 | 0x82;
              *(byte *)((long)target + 1) = (byte)(uVar9 >> 7);
              pbVar4 = (byte *)((long)target + 2);
              if (0x3fff < uVar9) {
                uVar8 = (ulong)*(byte *)((long)target + 1);
                uVar11 = (ulong)(uVar9 >> 7);
                do {
                  pbVar4[-1] = (byte)uVar8 | 0x80;
                  uVar8 = uVar11 >> 7;
                  *pbVar4 = (byte)uVar8;
                  pbVar4 = pbVar4 + 1;
                  uVar9 = (uint)uVar11;
                  uVar11 = uVar8;
                } while (0x3fff < uVar9);
              }
            }
            *pbVar4 = (byte)__n;
            memcpy(pbVar4 + 1,(s->_M_dataplus)._M_p,__n);
            target = pbVar4 + __n + 1;
            break;
          }
        }
        target = io::EpsCopyOutputStream::WriteStringOutline(stream,pUVar14->number_,s,target);
        break;
      case 4:
        uVar9 = pUVar14->number_ << 3;
        *target = (byte)uVar9 + 3;
        if (uVar9 < 0x80) {
          pbVar4 = (byte *)((long)target + 1);
        }
        else {
          *target = (byte)uVar9 | 0x83;
          *(byte *)((long)target + 1) = (byte)(uVar9 >> 7);
          pbVar4 = (byte *)((long)target + 2);
          if (0x3fff < uVar9) {
            uVar10 = (uint)*(byte *)((long)target + 1);
            uVar9 = uVar9 >> 7;
            do {
              pbVar4[-1] = (byte)uVar10 | 0x80;
              uVar10 = uVar9 >> 7;
              *pbVar4 = (byte)uVar10;
              pbVar4 = pbVar4 + 1;
              bVar3 = 0x3fff < uVar9;
              uVar9 = uVar10;
            } while (bVar3);
          }
        }
        if (pUVar14->type_ != 4) {
          __assert_fail("type() == TYPE_GROUP",
                        "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/unknown_field_set.h"
                        ,0x16a,
                        "const UnknownFieldSet &google::protobuf::UnknownField::group() const");
        }
        pbVar4 = InternalSerializeUnknownFieldsToArray((pUVar14->data_).group_,pbVar4,stream);
        if (stream->end_ <= pbVar4) {
          pbVar4 = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,pbVar4);
        }
        uVar9 = pUVar14->number_ << 3;
        *pbVar4 = (byte)uVar9 + 4;
        if (uVar9 < 0x80) {
          target = pbVar4 + 1;
        }
        else {
          *pbVar4 = (byte)uVar9 | 0x84;
          pbVar4[1] = (byte)(uVar9 >> 7);
          target = pbVar4 + 2;
          if (0x3fff < uVar9) {
            uVar10 = (uint)pbVar4[1];
            uVar9 = uVar9 >> 7;
            do {
              *(byte *)((long)target + -1) = (byte)uVar10 | 0x80;
              uVar10 = uVar9 >> 7;
              *target = (byte)uVar10;
              target = (uint8_t *)((long)target + 1);
              bVar3 = 0x3fff < uVar9;
              uVar9 = uVar10;
            } while (bVar3);
          }
        }
      }
      lVar13 = lVar13 + 1;
      pUVar14 = (unknown_fields->fields_).
                super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                ._M_impl.super__Vector_impl_data._M_start;
    } while (lVar13 < (int)((ulong)((long)(unknown_fields->fields_).
                                          super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                                          ._M_impl.super__Vector_impl_data._M_finish - (long)pUVar14
                                   ) >> 4));
  }
  return target;
}

Assistant:

uint8_t* WireFormat::InternalSerializeUnknownFieldsToArray(
    const UnknownFieldSet& unknown_fields, uint8_t* target,
    io::EpsCopyOutputStream* stream) {
  for (int i = 0; i < unknown_fields.field_count(); i++) {
    const UnknownField& field = unknown_fields.field(i);

    target = stream->EnsureSpace(target);
    switch (field.type()) {
      case UnknownField::TYPE_VARINT:
        target = WireFormatLite::WriteUInt64ToArray(field.number(),
                                                    field.varint(), target);
        break;
      case UnknownField::TYPE_FIXED32:
        target = WireFormatLite::WriteFixed32ToArray(field.number(),
                                                     field.fixed32(), target);
        break;
      case UnknownField::TYPE_FIXED64:
        target = WireFormatLite::WriteFixed64ToArray(field.number(),
                                                     field.fixed64(), target);
        break;
      case UnknownField::TYPE_LENGTH_DELIMITED:
        target = stream->WriteString(field.number(), field.length_delimited(),
                                     target);
        break;
      case UnknownField::TYPE_GROUP:
        target = WireFormatLite::WriteTagToArray(
            field.number(), WireFormatLite::WIRETYPE_START_GROUP, target);
        target = InternalSerializeUnknownFieldsToArray(field.group(), target,
                                                       stream);
        target = stream->EnsureSpace(target);
        target = WireFormatLite::WriteTagToArray(
            field.number(), WireFormatLite::WIRETYPE_END_GROUP, target);
        break;
    }
  }
  return target;
}